

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkRayTracingPipelineCreateInfoKHR *pipe,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  void *pvVar1;
  Data *pDVar2;
  bool bVar3;
  long lVar4;
  uint32_t i;
  ulong uVar5;
  Value dyn;
  Value groups;
  Value group;
  Value stages;
  Data local_1b8;
  Data local_1a8;
  Data local_198;
  StringRefType local_180;
  Data *local_170;
  Data local_168;
  StringRefType local_158;
  StringRefType local_148;
  StringRefType local_138;
  StringRefType local_128;
  StringRefType local_118;
  Data local_108;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  local_1a8.n.i64 = (Number)0x0;
  local_1a8.s.str = (Ch *)0x3000000000000;
  local_40.s = "flags";
  local_40.length = 5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_1a8.s,&local_40,pipe->flags,alloc);
  local_50.s = "layout";
  local_50.length = 6;
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&local_1b8.s,(uint64_t)pipe->layout,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1a8.s,&local_50,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1b8.s,alloc);
  local_60.s = "basePipelineHandle";
  local_60.length = 0x12;
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&local_1b8.s,(uint64_t)pipe->basePipelineHandle,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1a8.s,&local_60,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1b8.s,alloc);
  local_70.s = "basePipelineIndex";
  local_70.length = 0x11;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_1a8.s,&local_70,pipe->basePipelineIndex,alloc);
  local_80.s = "maxPipelineRayRecursionDepth";
  local_80.length = 0x1c;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_1a8.s,&local_80,pipe->maxPipelineRayRecursionDepth,alloc);
  if (pipe->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
    local_1b8.n.i64 = (Number)0x0;
    local_1b8.s.str = (Ch *)0x0;
    json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              (pipe->pDynamicState,alloc,(Value *)&local_1b8.s);
    local_90.s = "dynamicState";
    local_90.length = 0xc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_1a8.s,&local_90,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_1b8.s,alloc);
  }
  local_108.n = (Number)0x0;
  local_108.s.str = (Ch *)0x0;
  bVar3 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    (pipe->pStages,pipe->stageCount,alloc,(Value *)&local_108.s);
  if (bVar3) {
    local_a0.s = "stages";
    local_a0.length = 6;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_1a8.s,&local_a0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_108.s,alloc);
    if (pipe->pLibraryInterface != (VkRayTracingPipelineInterfaceCreateInfoKHR *)0x0) {
      local_198.n.i64 = (Number)0x0;
      local_198.s.str = (Ch *)0x3000000000000;
      local_b0.s = "maxPipelineRayPayloadSize";
      local_b0.length = 0x19;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_198.s,&local_b0,pipe->pLibraryInterface->maxPipelineRayPayloadSize,alloc)
      ;
      local_c0.s = "maxPipelineRayHitAttributeSize";
      local_c0.length = 0x1e;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_198.s,&local_c0,pipe->pLibraryInterface->maxPipelineRayHitAttributeSize,
                 alloc);
      pvVar1 = pipe->pLibraryInterface->pNext;
      if (pvVar1 != (void *)0x0) {
        local_1b8.n.i64 = (Number)0x0;
        local_1b8.s.str = (Ch *)0x0;
        bVar3 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar1,alloc,(Value *)&local_1b8.s,(DynamicStateInfo *)0x0);
        if (!bVar3) goto LAB_0011ba3f;
        local_180.s = "pNext";
        local_180.length = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_198.s,&local_180,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,alloc);
      }
      local_d0.s = "libraryInterface";
      local_d0.length = 0x10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1a8.s,&local_d0,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_198.s,alloc);
    }
    if (pipe->pLibraryInfo != (VkPipelineLibraryCreateInfoKHR *)0x0) {
      local_1b8.n.i64 = (Number)0x0;
      local_1b8.s.str = (Ch *)0x0;
      bVar3 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pipe->pLibraryInfo,alloc,false,(Value *)&local_1b8.s);
      if (!bVar3) goto LAB_0011ba3f;
      local_e0.s = "libraryInfo";
      local_e0.length = 0xb;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1a8.s,&local_e0,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1b8.s,alloc);
    }
    local_198.n = (Number)0x0;
    local_198.s.str = (Ch *)0x4000000000000;
    lVar4 = 0;
    uVar5 = 0;
    local_170 = &out_value->data_;
    for (; uVar5 < pipe->groupCount; uVar5 = uVar5 + 1) {
      local_168.n.i64 = (Number)0x0;
      local_168.s.str = (Ch *)0x3000000000000;
      local_118.s = "anyHitShader";
      local_118.length = 0xc;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_168.s,&local_118,*(uint *)((long)&pipe->pGroups->anyHitShader + lVar4),
                 alloc);
      local_128.s = "intersectionShader";
      local_128.length = 0x12;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_168.s,&local_128,
                 *(uint *)((long)&pipe->pGroups->intersectionShader + lVar4),alloc);
      local_138.s = "generalShader";
      local_138.length = 0xd;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_168.s,&local_138,*(uint *)((long)&pipe->pGroups->generalShader + lVar4),
                 alloc);
      local_148.s = "closestHitShader";
      local_148.length = 0x10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_168.s,&local_148,
                 *(uint *)((long)&pipe->pGroups->closestHitShader + lVar4),alloc);
      local_158.s = "type";
      local_158.length = 4;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkRayTracingShaderGroupTypeKHR>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_168.s,&local_158,
                 *(VkRayTracingShaderGroupTypeKHR *)((long)&pipe->pGroups->type + lVar4),alloc);
      pvVar1 = *(void **)((long)&pipe->pGroups->pNext + lVar4);
      if (pvVar1 != (void *)0x0) {
        local_1b8.n.i64 = (Number)0x0;
        local_1b8.s.str = (Ch *)0x0;
        bVar3 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar1,alloc,(Value *)&local_1b8.s,(DynamicStateInfo *)0x0);
        if (!bVar3) goto LAB_0011ba3f;
        local_180.s = "pNext";
        local_180.length = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_168.s,&local_180,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,alloc);
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_198.s,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_168.s,alloc);
      lVar4 = lVar4 + 0x30;
    }
    local_f0.s = "groups";
    local_f0.length = 6;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_1a8.s,&local_f0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_198.s,alloc);
    pDVar2 = local_170;
    if (pipe->pNext != (void *)0x0) {
      local_1b8.n = (Number)0x0;
      local_1b8.s.str = (Ch *)0x0;
      bVar3 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pipe->pNext,alloc,(Value *)&local_1b8.s,(DynamicStateInfo *)0x0);
      if (!bVar3) goto LAB_0011ba3f;
      local_180.s = "pNext";
      local_180.length = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1a8.s,&local_180,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1b8.s,alloc);
    }
    bVar3 = true;
    if (&local_1a8 != pDVar2) {
      pDVar2->n = local_1a8.n;
      (&pDVar2->n)[1] = (Number)local_1a8.s.str;
    }
  }
  else {
LAB_0011ba3f:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool json_value(const VkRayTracingPipelineCreateInfoKHR &pipe, Allocator &alloc, Value *out_value)
{
	Value p(kObjectType);
	p.AddMember("flags", pipe.flags, alloc);
	p.AddMember("layout", uint64_string(api_object_cast<uint64_t>(pipe.layout), alloc), alloc);
	p.AddMember("basePipelineHandle", uint64_string(api_object_cast<uint64_t>(pipe.basePipelineHandle), alloc), alloc);
	p.AddMember("basePipelineIndex", pipe.basePipelineIndex, alloc);
	p.AddMember("maxPipelineRayRecursionDepth", pipe.maxPipelineRayRecursionDepth, alloc);

	if (pipe.pDynamicState)
	{
		Value dyn;
		if (!json_value(*pipe.pDynamicState, alloc, &dyn))
			return false;
		p.AddMember("dynamicState", dyn, alloc);
	}

	Value stages;
	if (!json_value(pipe.pStages, pipe.stageCount, alloc, &stages))
		return false;
	p.AddMember("stages", stages, alloc);

	if (pipe.pLibraryInterface)
	{
		Value iface(kObjectType);
		iface.AddMember("maxPipelineRayPayloadSize", pipe.pLibraryInterface->maxPipelineRayPayloadSize, alloc);
		iface.AddMember("maxPipelineRayHitAttributeSize", pipe.pLibraryInterface->maxPipelineRayHitAttributeSize, alloc);
		if (!pnext_chain_add_json_value(iface, *pipe.pLibraryInterface, alloc, nullptr))
			return false;
		p.AddMember("libraryInterface", iface, alloc);
	}

	if (pipe.pLibraryInfo)
	{
		Value library_info;
		if (!json_value(*pipe.pLibraryInfo, alloc, false, &library_info))
			return false;
		p.AddMember("libraryInfo", library_info, alloc);
	}

	Value groups(kArrayType);
	for (uint32_t i = 0; i < pipe.groupCount; i++)
	{
		Value group(kObjectType);
		group.AddMember("anyHitShader", pipe.pGroups[i].anyHitShader, alloc);
		group.AddMember("intersectionShader", pipe.pGroups[i].intersectionShader, alloc);
		group.AddMember("generalShader", pipe.pGroups[i].generalShader, alloc);
		group.AddMember("closestHitShader", pipe.pGroups[i].closestHitShader, alloc);
		group.AddMember("type", pipe.pGroups[i].type, alloc);
		if (!pnext_chain_add_json_value(group, pipe.pGroups[i], alloc, nullptr))
			return false;
		groups.PushBack(group, alloc);
	}
	p.AddMember("groups", groups, alloc);

	if (!pnext_chain_add_json_value(p, pipe, alloc, nullptr))
		return false;

	*out_value = p;
	return true;
}